

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O2

bool wallet::LoadWallets(WalletContext *context)

{
  long lVar1;
  Chain *pCVar2;
  string original;
  string *string;
  pointer this;
  long in_FS_OFFSET;
  bool bVar3;
  char cVar4;
  pair<std::_Rb_tree_iterator<fs::path>,_bool> pVar5;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_fffffffffffffdc8;
  Chain *pCVar6;
  duration dVar7;
  allocator<char> local_211;
  long *local_210;
  shared_ptr<wallet::CWallet> pwallet;
  long *local_1f0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  vector<UniValue,_std::allocator<UniValue>_> local_1c8 [2];
  string local_190 [32];
  bilingual_str local_170;
  bilingual_str local_130;
  bilingual_str error;
  DatabaseOptions options;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_paths;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = context->chain;
  wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header;
  wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  wallet_paths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar6 = pCVar2;
  wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options,"wallet",(allocator<char> *)&error);
  (*pCVar2->_vptr_Chain[0x2f])(local_1c8,pCVar2,&options);
  std::__cxx11::string::~string((string *)&options);
  this = local_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
  dVar7.__r = (rep)local_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  do {
    bVar3 = this == (pointer)dVar7.__r;
    if (bVar3) {
LAB_004072a8:
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(local_1c8);
      std::
      _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
      ::~_Rb_tree(&wallet_paths._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar3;
      }
      __stack_chk_fail();
    }
    if (this->typ != VSTR) {
      _((bilingual_str *)&options,(ConstevalStringLiteral)0x6f0348);
      (*pCVar6->_vptr_Chain[0x27])(pCVar6,&options);
      bilingual_str::~bilingual_str((bilingual_str *)&options);
      goto LAB_004072a8;
    }
    string = UniValue::get_str_abi_cxx11_(this);
    fs::PathFromString((path *)&options,string);
    pVar5 = std::
            _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
            ::_M_insert_unique<fs::path>(&wallet_paths._M_t,(path *)&options);
    std::filesystem::__cxx11::path::~path((path *)&options);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      options.require_existing = false;
      options.require_create = false;
      options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
      super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
      options.create_flags = 0;
      options.create_passphrase._M_dataplus._M_p = (pointer)&options.create_passphrase.field_2;
      options.create_passphrase._M_string_length = 0;
      options.create_passphrase.field_2._M_local_buf[0] = '\0';
      options.verify = true;
      options.use_unsafe_sync = false;
      options.use_shared_memory = false;
      options.max_log_mb = 100;
      ReadDatabaseArgs(context->args,&options);
      error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
      error.original._M_string_length = 0;
      options.require_existing = true;
      options._56_2_ = options._56_2_ & 0xff00;
      error.original.field_2._M_local_buf[0] = '\0';
      error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
      error.translated._M_string_length = 0;
      error.translated.field_2._M_local_buf[0] = '\0';
      warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MakeWalletDatabase((wallet *)&local_1f0,string,&options,&status,&error);
      if (local_1f0 == (long *)0x0) {
        cVar4 = '\x03';
        if (status != FAILED_NOT_FOUND) goto LAB_004070b8;
      }
      else {
LAB_004070b8:
        _(&local_130,(ConstevalStringLiteral)0x6f0426);
        (*pCVar6->_vptr_Chain[0x25])(pCVar6,&local_130.translated);
        bilingual_str::~bilingual_str(&local_130);
        if (local_1f0 == (long *)0x0) {
          pwallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          pwallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_210 = local_1f0;
          local_1f0 = (long *)0x0;
          in_stack_fffffffffffffdc8 = &warnings;
          CWallet::Create((CWallet *)&pwallet,context,string,
                          (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                           )&local_210,options.create_flags,&error,in_stack_fffffffffffffdc8);
          if (local_210 != (long *)0x0) {
            (**(code **)(*local_210 + 8))();
          }
          local_210 = (long *)0x0;
        }
        if (warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
            super__Vector_impl_data._M_start !=
            warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>(local_190,"\n",&local_211);
          original._M_string_length = (size_type)pCVar6;
          original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
          original.field_2._M_allocated_capacity = (size_type)context;
          original.field_2._8_8_ = dVar7.__r;
          Untranslated(&local_170,original);
          util::
          Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str,util::Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str>(std::vector<bilingual_str,std::allocator<bilingual_str>>const&,bilingual_str_const&)::_lambda(auto:1_const&)_1_>
                    (&local_130,(util *)&warnings,&local_170);
          (*pCVar6->_vptr_Chain[0x26])(pCVar6,&local_130);
          bilingual_str::~bilingual_str(&local_130);
          bilingual_str::~bilingual_str(&local_170);
          std::__cxx11::string::~string(local_190);
        }
        cVar4 = pwallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0;
        if ((bool)cVar4) {
          (*pCVar6->_vptr_Chain[0x27])(pCVar6,&error);
        }
        else {
          NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)&pwallet);
          AddWallet(context,(shared_ptr<wallet::CWallet> *)&pwallet);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &pwallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (local_1f0 != (long *)0x0) {
          (**(code **)(*local_1f0 + 8))();
        }
      }
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
      bilingual_str::~bilingual_str(&error);
      _GLOBAL__N_1::std::__cxx11::
      basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
                (&options.create_passphrase);
      if ((cVar4 != '\x03') && (cVar4 != '\0')) goto LAB_004072a8;
    }
    this = this + 1;
  } while( true );
}

Assistant:

bool LoadWallets(WalletContext& context)
{
    interfaces::Chain& chain = *context.chain;
    try {
        std::set<fs::path> wallet_paths;
        for (const auto& wallet : chain.getSettingsList("wallet")) {
            if (!wallet.isStr()) {
                chain.initError(_("Invalid value detected for '-wallet' or '-nowallet'. "
                                  "'-wallet' requires a string value, while '-nowallet' accepts only '1' to disable all wallets"));
                return false;
            }
            const auto& name = wallet.get_str();
            if (!wallet_paths.insert(fs::PathFromString(name)).second) {
                continue;
            }
            DatabaseOptions options;
            DatabaseStatus status;
            ReadDatabaseArgs(*context.args, options);
            options.require_existing = true;
            options.verify = false; // No need to verify, assuming verified earlier in VerifyWallets()
            bilingual_str error;
            std::vector<bilingual_str> warnings;
            std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(name, options, status, error);
            if (!database && status == DatabaseStatus::FAILED_NOT_FOUND) {
                continue;
            }
            chain.initMessage(_("Loading wallet…").translated);
            std::shared_ptr<CWallet> pwallet = database ? CWallet::Create(context, name, std::move(database), options.create_flags, error, warnings) : nullptr;
            if (!warnings.empty()) chain.initWarning(Join(warnings, Untranslated("\n")));
            if (!pwallet) {
                chain.initError(error);
                return false;
            }

            NotifyWalletLoaded(context, pwallet);
            AddWallet(context, pwallet);
        }
        return true;
    } catch (const std::runtime_error& e) {
        chain.initError(Untranslated(e.what()));
        return false;
    }
}